

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdns.c
# Opt level: O3

size_t mdns_record_parse_txt
                 (void *buffer,size_t size,size_t offset,size_t length,mdns_record_txt_t *records,
                 size_t capacity)

{
  ulong uVar1;
  size_t sVar2;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  
  uVar1 = length + offset;
  if (size <= length + offset) {
    uVar1 = size;
  }
  if (capacity == 0) {
    return 0;
  }
  sVar2 = 0;
LAB_0017c97b:
  uVar5 = offset;
  if (uVar1 <= offset) {
    return sVar2;
  }
  do {
    uVar3 = (ulong)*(byte *)((long)buffer + uVar5);
    offset = uVar5 + uVar3 + 1;
    if (uVar3 != 0) {
      pcVar4 = (char *)((long)buffer + uVar5 + 1);
      uVar5 = 0;
      do {
        if ((byte)(pcVar4[uVar5] + 0x81U) < 0xa1) break;
        if (pcVar4[uVar5] == '=') goto LAB_0017c9be;
        uVar5 = uVar5 + 1;
      } while (uVar3 != uVar5);
      uVar5 = 0;
LAB_0017c9be:
      if (uVar5 != 0) break;
    }
    uVar5 = offset;
    if (uVar1 <= offset) {
      return sVar2;
    }
  } while( true );
  records[sVar2].key.str = pcVar4;
  if (uVar5 < uVar3) {
    records[sVar2].key.length = uVar5;
    records[sVar2].value.str = pcVar4 + uVar5 + 1;
    records[sVar2].value.length = ~uVar5 + uVar3;
  }
  else {
    records[sVar2].key.length = uVar3;
  }
  sVar2 = sVar2 + 1;
  if (sVar2 == capacity) {
    return capacity;
  }
  goto LAB_0017c97b;
}

Assistant:

size_t
mdns_record_parse_txt(const void* buffer, size_t size, size_t offset, size_t length,
                      mdns_record_txt_t* records, size_t capacity) {
	size_t parsed = 0;
	const char* strdata;
	size_t separator, sublength;
	size_t end = offset + length;

	if (size < end)
		end = size;

	while ((offset < end) && (parsed < capacity)) {
		strdata = (const char*)buffer + offset;
		sublength = *(const unsigned char*)strdata;

		++strdata;
		offset += sublength + 1;

		separator = 0;
		for (size_t c = 0; c < sublength; ++c) {
			//DNS-SD TXT record keys MUST be printable US-ASCII, [0x20, 0x7E]
			if ((strdata[c] < 0x20) || (strdata[c] > 0x7E))
				break;
			if (strdata[c] == '=') {
				separator = c;
				break;
			}
		}

		if (!separator)
			continue;

		if (separator < sublength) {
			records[parsed].key.str = strdata;
			records[parsed].key.length = separator;
			records[parsed].value.str = strdata + separator + 1;
			records[parsed].value.length = sublength - (separator + 1);
		}
		else {
			records[parsed].key.str = strdata;
			records[parsed].key.length = sublength;
		}

		++parsed;
	}

	return parsed;
}